

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  uint uVar8;
  uint uVar9;
  uint _w;
  undefined4 uVar10;
  void *pvVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int *piVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  void *pvVar37;
  void *pvVar38;
  int iVar39;
  int iVar40;
  void *pvVar41;
  Allocator *pAVar42;
  long lVar43;
  void *pvVar44;
  void *pvVar45;
  Allocator *pAVar46;
  void *pvVar47;
  ulong uVar48;
  void *pvVar49;
  ulong uVar50;
  void *pvVar51;
  void *pvVar52;
  Allocator *pAVar53;
  int iVar54;
  void *pvVar55;
  void *pvVar56;
  Allocator *pAVar57;
  ulong uVar58;
  void *pvVar59;
  int iVar60;
  void *pvVar61;
  void *pvVar62;
  void *pvVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  void *pvVar67;
  void *pvVar68;
  void *pvVar69;
  void *pvVar70;
  void *pvVar71;
  void *pvVar72;
  void *pvVar73;
  void *pvVar74;
  long lVar75;
  long lVar76;
  void *pvVar77;
  void *pvVar78;
  float fVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar86 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar123 [64];
  undefined1 auVar125 [16];
  float fVar124;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar129 [64];
  float fVar134;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 in_ZMM5 [64];
  undefined1 auVar138 [64];
  undefined1 auVar145 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  undefined1 auVar149 [16];
  undefined1 in_ZMM9 [64];
  float fVar151;
  undefined1 auVar150 [32];
  undefined1 in_ZMM10 [64];
  float *bias_c_G;
  float *gates_data_F;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  float *gates_data_G;
  float *gates_data_O;
  float *gates_data_I;
  void *local_320;
  void *local_318;
  void *local_308;
  void *local_298;
  void *local_238;
  void *local_1a0;
  void *local_198;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  Mat local_78;
  long lVar30;
  undefined1 auVar111 [32];
  undefined1 auVar117 [32];
  undefined1 auVar120 [32];
  undefined1 auVar128 [32];
  
  uVar8 = bottom_blob->w;
  uVar9 = bottom_blob->h;
  _w = top_blob->w;
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,_w,4,4,opt->workspace_allocator);
  iVar39 = -100;
  if (((Allocator *)local_78.data != (Allocator *)0x0) && ((long)local_78.c * local_78.cstep != 0))
  {
    if (0 < (int)uVar9) {
      uVar58 = (ulong)(int)_w;
      uVar50 = uVar58 & 0xfffffffffffffffe;
      iVar54 = (int)uVar8 >> 3;
      iVar60 = (int)_w >> 3;
      lVar29 = (long)(int)(_w * 2);
      lVar36 = (long)(int)(_w * 3);
      iVar39 = (uVar8 & 7) + 1;
      iVar40 = (_w & 7) + 1;
      uVar35 = 0;
      do {
        uVar27 = ~uVar35 + uVar9;
        if (reverse == 0) {
          uVar27 = uVar35;
        }
        lVar30 = (long)(int)uVar27;
        if (0 < (int)_w >> 1) {
          pvVar47 = (void *)(bottom_blob->w * lVar30 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar71 = bias_c->data;
          lVar31 = (long)bias_c->w * bias_c->elemsize;
          lVar32 = (long)local_78.w * local_78.elemsize;
          pvVar11 = weight_xc->data;
          lVar64 = (long)weight_xc->w * weight_xc->elemsize;
          lVar43 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar55 = (void *)(lVar64 * uVar58 + (long)pvVar11);
          pvVar68 = (void *)(lVar64 * lVar29 + (long)pvVar11);
          pvVar70 = (void *)(lVar64 * lVar36 + (long)pvVar11);
          pvVar73 = (void *)(lVar64 * (uVar58 + 1) + (long)pvVar11);
          pvVar51 = (void *)(lVar64 * (lVar29 + 1) + (long)pvVar11);
          local_168 = (void *)(lVar64 * (lVar36 + 1) + (long)pvVar11);
          pvVar45 = weight_hc->data;
          local_170 = (void *)(lVar43 * uVar58 + (long)pvVar45);
          local_178 = (void *)(lVar43 * lVar29 + (long)pvVar45);
          pvVar61 = (void *)(lVar43 * lVar36 + (long)pvVar45);
          pvVar74 = (void *)(lVar43 * (uVar58 + 1) + (long)pvVar45);
          pvVar72 = (void *)(lVar43 * (lVar29 + 1) + (long)pvVar45);
          pvVar37 = (void *)(lVar43 * (lVar36 + 1) + (long)pvVar45);
          pvVar49 = hidden_state->data;
          lVar33 = lVar64 * 2;
          pvVar63 = (void *)((long)pvVar11 + lVar64);
          lVar34 = lVar43 * 2;
          pvVar59 = (void *)((long)pvVar45 + lVar43);
          uVar48 = 0;
          pvVar38 = pvVar45;
          pvVar56 = pvVar11;
          do {
            lVar76 = uVar58 + uVar48 * 2;
            lVar1 = lVar29 + uVar48 * 2;
            lVar2 = lVar36 + uVar48 * 2;
            lVar5 = uVar48 * 2 + 1;
            lVar6 = uVar58 + 1 + uVar48 * 2;
            lVar65 = lVar29 + uVar48 * 2 + 1;
            lVar75 = lVar36 + uVar48 * 2 + 1;
            if (iVar54 < 1) {
              local_180 = (void *)(lVar64 * uVar48 * 2 + (long)pvVar11);
              local_188 = (void *)(lVar64 * lVar76 + (long)pvVar11);
              local_190 = (void *)(lVar64 * lVar1 + (long)pvVar11);
              pvVar62 = (void *)(lVar64 * lVar2 + (long)pvVar11);
              local_198 = (void *)(lVar64 * lVar5 + (long)pvVar11);
              local_1a0 = (void *)(lVar64 * lVar6 + (long)pvVar11);
              pvVar41 = (void *)(lVar64 * lVar65 + (long)pvVar11);
              pvVar67 = (void *)(lVar64 * lVar75 + (long)pvVar11);
              auVar86 = ZEXT864(0);
              auVar101 = ZEXT864(0);
              auVar123 = ZEXT864(0);
              auVar129 = ZEXT864(0);
              auVar138 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar148 = ZEXT864(0);
              auVar112 = ZEXT864(0);
              pvVar78 = pvVar47;
            }
            else {
              auVar112 = ZEXT864(0);
              lVar66 = 0;
              auVar148 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar138 = ZEXT864(0);
              auVar129 = ZEXT864(0);
              auVar123 = ZEXT864(0);
              auVar101 = ZEXT864(0);
              auVar86 = ZEXT864(0);
              iVar28 = iVar54 + 1;
              do {
                pfVar7 = (float *)((long)pvVar47 + lVar66);
                fVar124 = *pfVar7;
                fVar134 = pfVar7[1];
                fVar130 = pfVar7[2];
                fVar139 = pfVar7[3];
                fVar131 = pfVar7[4];
                fVar140 = pfVar7[5];
                fVar132 = pfVar7[6];
                pfVar3 = (float *)((long)pvVar56 + lVar66);
                fVar133 = in_ZMM9._28_4_;
                auVar86 = ZEXT3264(CONCAT428(fVar133 + auVar86._28_4_,
                                             CONCAT424(fVar132 * pfVar3[6] + auVar86._24_4_,
                                                       CONCAT420(fVar140 * pfVar3[5] +
                                                                 auVar86._20_4_,
                                                                 CONCAT416(fVar131 * pfVar3[4] +
                                                                           auVar86._16_4_,
                                                                           CONCAT412(fVar139 * 
                                                  pfVar3[3] + auVar86._12_4_,
                                                  CONCAT48(fVar130 * pfVar3[2] + auVar86._8_4_,
                                                           CONCAT44(fVar134 * pfVar3[1] +
                                                                    auVar86._4_4_,
                                                                    fVar124 * *pfVar3 +
                                                                    auVar86._0_4_))))))));
                pfVar3 = (float *)((long)pvVar55 + lVar66);
                pfVar4 = (float *)((long)pvVar68 + lVar66);
                auVar101 = ZEXT3264(CONCAT428(fVar133 + auVar101._28_4_,
                                              CONCAT424(fVar132 * pfVar3[6] + auVar101._24_4_,
                                                        CONCAT420(fVar140 * pfVar3[5] +
                                                                  auVar101._20_4_,
                                                                  CONCAT416(fVar131 * pfVar3[4] +
                                                                            auVar101._16_4_,
                                                                            CONCAT412(fVar139 * 
                                                  pfVar3[3] + auVar101._12_4_,
                                                  CONCAT48(fVar130 * pfVar3[2] + auVar101._8_4_,
                                                           CONCAT44(fVar134 * pfVar3[1] +
                                                                    auVar101._4_4_,
                                                                    fVar124 * *pfVar3 +
                                                                    auVar101._0_4_))))))));
                fVar151 = in_ZMM10._28_4_;
                auVar123 = ZEXT3264(CONCAT428(fVar151 + auVar123._28_4_,
                                              CONCAT424(fVar132 * pfVar4[6] + auVar123._24_4_,
                                                        CONCAT420(fVar140 * pfVar4[5] +
                                                                  auVar123._20_4_,
                                                                  CONCAT416(fVar131 * pfVar4[4] +
                                                                            auVar123._16_4_,
                                                                            CONCAT412(fVar139 * 
                                                  pfVar4[3] + auVar123._12_4_,
                                                  CONCAT48(fVar130 * pfVar4[2] + auVar123._8_4_,
                                                           CONCAT44(fVar134 * pfVar4[1] +
                                                                    auVar123._4_4_,
                                                                    fVar124 * *pfVar4 +
                                                                    auVar123._0_4_))))))));
                pfVar3 = (float *)((long)pvVar70 + lVar66);
                auVar129 = ZEXT3264(CONCAT428(fVar133 + auVar129._28_4_,
                                              CONCAT424(fVar132 * pfVar3[6] + auVar129._24_4_,
                                                        CONCAT420(fVar140 * pfVar3[5] +
                                                                  auVar129._20_4_,
                                                                  CONCAT416(fVar131 * pfVar3[4] +
                                                                            auVar129._16_4_,
                                                                            CONCAT412(fVar139 * 
                                                  pfVar3[3] + auVar129._12_4_,
                                                  CONCAT48(fVar130 * pfVar3[2] + auVar129._8_4_,
                                                           CONCAT44(fVar134 * pfVar3[1] +
                                                                    auVar129._4_4_,
                                                                    fVar124 * *pfVar3 +
                                                                    auVar129._0_4_))))))));
                pfVar3 = (float *)((long)pvVar63 + lVar66);
                auVar138 = ZEXT3264(CONCAT428(fVar133 + auVar138._28_4_,
                                              CONCAT424(fVar132 * pfVar3[6] + auVar138._24_4_,
                                                        CONCAT420(fVar140 * pfVar3[5] +
                                                                  auVar138._20_4_,
                                                                  CONCAT416(fVar131 * pfVar3[4] +
                                                                            auVar138._16_4_,
                                                                            CONCAT412(fVar139 * 
                                                  pfVar3[3] + auVar138._12_4_,
                                                  CONCAT48(fVar130 * pfVar3[2] + auVar138._8_4_,
                                                           CONCAT44(fVar134 * pfVar3[1] +
                                                                    auVar138._4_4_,
                                                                    fVar124 * *pfVar3 +
                                                                    auVar138._0_4_))))))));
                pfVar3 = (float *)((long)pvVar73 + lVar66);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar133,CONCAT424(fVar132 * pfVar3[6],
                                                               CONCAT420(fVar140 * pfVar3[5],
                                                                         CONCAT416(fVar131 * pfVar3[
                                                  4],CONCAT412(fVar139 * pfVar3[3],
                                                               CONCAT48(fVar130 * pfVar3[2],
                                                                        CONCAT44(fVar134 * pfVar3[1]
                                                                                 ,fVar124 * *pfVar3)
                                                                       )))))));
                pfVar4 = (float *)((long)pvVar51 + lVar66);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar151,CONCAT424(fVar132 * pfVar4[6],
                                                                CONCAT420(fVar140 * pfVar4[5],
                                                                          CONCAT416(fVar131 * pfVar4
                                                  [4],CONCAT412(fVar139 * pfVar4[3],
                                                                CONCAT48(fVar130 * pfVar4[2],
                                                                         CONCAT44(fVar134 * pfVar4[1
                                                  ],fVar124 * *pfVar4))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar133 + in_ZMM6._28_4_,
                                             CONCAT424(fVar132 * pfVar3[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar140 * pfVar3[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar131 * pfVar3[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar139 * 
                                                  pfVar3[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar130 * pfVar3[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar134 * pfVar3[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar124 * *pfVar3 +
                                                                    in_ZMM6._0_4_))))))));
                auVar148 = ZEXT3264(CONCAT428(fVar151 + auVar148._28_4_,
                                              CONCAT424(fVar132 * pfVar4[6] + auVar148._24_4_,
                                                        CONCAT420(fVar140 * pfVar4[5] +
                                                                  auVar148._20_4_,
                                                                  CONCAT416(fVar131 * pfVar4[4] +
                                                                            auVar148._16_4_,
                                                                            CONCAT412(fVar139 * 
                                                  pfVar4[3] + auVar148._12_4_,
                                                  CONCAT48(fVar130 * pfVar4[2] + auVar148._8_4_,
                                                           CONCAT44(fVar134 * pfVar4[1] +
                                                                    auVar148._4_4_,
                                                                    fVar124 * *pfVar4 +
                                                                    auVar148._0_4_))))))));
                pfVar3 = (float *)((long)local_168 + lVar66);
                auVar112 = ZEXT3264(CONCAT428(pfVar7[7] + auVar112._28_4_,
                                              CONCAT424(fVar132 * pfVar3[6] + auVar112._24_4_,
                                                        CONCAT420(fVar140 * pfVar3[5] +
                                                                  auVar112._20_4_,
                                                                  CONCAT416(fVar131 * pfVar3[4] +
                                                                            auVar112._16_4_,
                                                                            CONCAT412(fVar139 * 
                                                  pfVar3[3] + auVar112._12_4_,
                                                  CONCAT48(fVar130 * pfVar3[2] + auVar112._8_4_,
                                                           CONCAT44(fVar134 * pfVar3[1] +
                                                                    auVar112._4_4_,
                                                                    fVar124 * *pfVar3 +
                                                                    auVar112._0_4_))))))));
                lVar66 = lVar66 + 0x20;
                iVar28 = iVar28 + -1;
              } while (1 < iVar28);
              local_180 = (void *)((long)pvVar56 + lVar66);
              local_188 = (void *)((long)pvVar55 + lVar66);
              local_190 = (void *)((long)pvVar68 + lVar66);
              pvVar62 = (void *)((long)pvVar70 + lVar66);
              local_198 = (void *)((long)pvVar63 + lVar66);
              local_1a0 = (void *)((long)pvVar73 + lVar66);
              pvVar41 = (void *)((long)pvVar51 + lVar66);
              pvVar67 = (void *)(lVar66 + (long)local_168);
              pvVar78 = (void *)((long)pvVar47 + lVar66);
            }
            auVar126 = auVar129._0_32_;
            auVar147 = auVar148._0_32_;
            auVar94 = auVar101._0_32_;
            auVar80 = auVar86._0_32_;
            auVar115 = auVar123._0_32_;
            auVar135 = auVar138._0_32_;
            auVar104 = auVar112._0_32_;
            if (iVar60 < 1) {
              pvVar44 = (void *)(lVar43 * uVar48 * 2 + (long)pvVar45);
              local_320 = (void *)(lVar76 * lVar43 + (long)pvVar45);
              local_298 = (void *)(lVar1 * lVar43 + (long)pvVar45);
              local_238 = (void *)(lVar2 * lVar43 + (long)pvVar45);
              pvVar69 = (void *)(lVar43 * lVar5 + (long)pvVar45);
              local_318 = (void *)(lVar6 * lVar43 + (long)pvVar45);
              local_308 = (void *)(lVar65 * lVar43 + (long)pvVar45);
              pvVar77 = (void *)(lVar75 * lVar43 + (long)pvVar45);
              pvVar52 = pvVar49;
            }
            else {
              lVar76 = 0;
              iVar28 = iVar60 + 1;
              do {
                pfVar3 = (float *)((long)pvVar49 + lVar76);
                fVar124 = *pfVar3;
                fVar134 = pfVar3[1];
                fVar130 = pfVar3[2];
                fVar139 = pfVar3[3];
                fVar131 = pfVar3[4];
                fVar140 = pfVar3[5];
                fVar132 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar38 + lVar76);
                auVar80._0_4_ = fVar124 * *pfVar4 + auVar86._0_4_;
                auVar80._4_4_ = fVar134 * pfVar4[1] + auVar86._4_4_;
                auVar80._8_4_ = fVar130 * pfVar4[2] + auVar86._8_4_;
                auVar80._12_4_ = fVar139 * pfVar4[3] + auVar86._12_4_;
                auVar80._16_4_ = fVar131 * pfVar4[4] + auVar86._16_4_;
                auVar80._20_4_ = fVar140 * pfVar4[5] + auVar86._20_4_;
                auVar80._24_4_ = fVar132 * pfVar4[6] + auVar86._24_4_;
                fVar133 = in_ZMM9._28_4_;
                auVar80._28_4_ = fVar133 + auVar86._28_4_;
                auVar86 = ZEXT3264(auVar80);
                pfVar4 = (float *)((long)local_170 + lVar76);
                pfVar7 = (float *)((long)local_178 + lVar76);
                auVar94._0_4_ = fVar124 * *pfVar4 + auVar101._0_4_;
                auVar94._4_4_ = fVar134 * pfVar4[1] + auVar101._4_4_;
                auVar94._8_4_ = fVar130 * pfVar4[2] + auVar101._8_4_;
                auVar94._12_4_ = fVar139 * pfVar4[3] + auVar101._12_4_;
                auVar94._16_4_ = fVar131 * pfVar4[4] + auVar101._16_4_;
                auVar94._20_4_ = fVar140 * pfVar4[5] + auVar101._20_4_;
                auVar94._24_4_ = fVar132 * pfVar4[6] + auVar101._24_4_;
                auVar94._28_4_ = fVar133 + auVar101._28_4_;
                auVar101 = ZEXT3264(auVar94);
                auVar115._0_4_ = fVar124 * *pfVar7 + auVar123._0_4_;
                auVar115._4_4_ = fVar134 * pfVar7[1] + auVar123._4_4_;
                auVar115._8_4_ = fVar130 * pfVar7[2] + auVar123._8_4_;
                auVar115._12_4_ = fVar139 * pfVar7[3] + auVar123._12_4_;
                auVar115._16_4_ = fVar131 * pfVar7[4] + auVar123._16_4_;
                auVar115._20_4_ = fVar140 * pfVar7[5] + auVar123._20_4_;
                auVar115._24_4_ = fVar132 * pfVar7[6] + auVar123._24_4_;
                fVar151 = in_ZMM10._28_4_;
                auVar115._28_4_ = fVar151 + auVar123._28_4_;
                auVar123 = ZEXT3264(auVar115);
                pfVar4 = (float *)((long)pvVar61 + lVar76);
                auVar126._0_4_ = fVar124 * *pfVar4 + auVar129._0_4_;
                auVar126._4_4_ = fVar134 * pfVar4[1] + auVar129._4_4_;
                auVar126._8_4_ = fVar130 * pfVar4[2] + auVar129._8_4_;
                auVar126._12_4_ = fVar139 * pfVar4[3] + auVar129._12_4_;
                auVar126._16_4_ = fVar131 * pfVar4[4] + auVar129._16_4_;
                auVar126._20_4_ = fVar140 * pfVar4[5] + auVar129._20_4_;
                auVar126._24_4_ = fVar132 * pfVar4[6] + auVar129._24_4_;
                auVar126._28_4_ = fVar133 + auVar129._28_4_;
                auVar129 = ZEXT3264(auVar126);
                pfVar4 = (float *)((long)pvVar59 + lVar76);
                auVar135._0_4_ = fVar124 * *pfVar4 + auVar138._0_4_;
                auVar135._4_4_ = fVar134 * pfVar4[1] + auVar138._4_4_;
                auVar135._8_4_ = fVar130 * pfVar4[2] + auVar138._8_4_;
                auVar135._12_4_ = fVar139 * pfVar4[3] + auVar138._12_4_;
                auVar135._16_4_ = fVar131 * pfVar4[4] + auVar138._16_4_;
                auVar135._20_4_ = fVar140 * pfVar4[5] + auVar138._20_4_;
                auVar135._24_4_ = fVar132 * pfVar4[6] + auVar138._24_4_;
                auVar135._28_4_ = fVar133 + auVar138._28_4_;
                auVar138 = ZEXT3264(auVar135);
                pfVar4 = (float *)((long)pvVar74 + lVar76);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar133,CONCAT424(fVar132 * pfVar4[6],
                                                               CONCAT420(fVar140 * pfVar4[5],
                                                                         CONCAT416(fVar131 * pfVar4[
                                                  4],CONCAT412(fVar139 * pfVar4[3],
                                                               CONCAT48(fVar130 * pfVar4[2],
                                                                        CONCAT44(fVar134 * pfVar4[1]
                                                                                 ,fVar124 * *pfVar4)
                                                                       )))))));
                pfVar7 = (float *)((long)pvVar72 + lVar76);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar151,CONCAT424(fVar132 * pfVar7[6],
                                                                CONCAT420(fVar140 * pfVar7[5],
                                                                          CONCAT416(fVar131 * pfVar7
                                                  [4],CONCAT412(fVar139 * pfVar7[3],
                                                                CONCAT48(fVar130 * pfVar7[2],
                                                                         CONCAT44(fVar134 * pfVar7[1
                                                  ],fVar124 * *pfVar7))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar133 + in_ZMM6._28_4_,
                                             CONCAT424(fVar132 * pfVar4[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar140 * pfVar4[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar131 * pfVar4[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar139 * 
                                                  pfVar4[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar130 * pfVar4[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar134 * pfVar4[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar124 * *pfVar4 +
                                                                    in_ZMM6._0_4_))))))));
                auVar147._0_4_ = fVar124 * *pfVar7 + auVar148._0_4_;
                auVar147._4_4_ = fVar134 * pfVar7[1] + auVar148._4_4_;
                auVar147._8_4_ = fVar130 * pfVar7[2] + auVar148._8_4_;
                auVar147._12_4_ = fVar139 * pfVar7[3] + auVar148._12_4_;
                auVar147._16_4_ = fVar131 * pfVar7[4] + auVar148._16_4_;
                auVar147._20_4_ = fVar140 * pfVar7[5] + auVar148._20_4_;
                auVar147._24_4_ = fVar132 * pfVar7[6] + auVar148._24_4_;
                auVar147._28_4_ = fVar151 + auVar148._28_4_;
                auVar148 = ZEXT3264(auVar147);
                pfVar4 = (float *)((long)pvVar37 + lVar76);
                auVar104._0_4_ = fVar124 * *pfVar4 + auVar112._0_4_;
                auVar104._4_4_ = fVar134 * pfVar4[1] + auVar112._4_4_;
                auVar104._8_4_ = fVar130 * pfVar4[2] + auVar112._8_4_;
                auVar104._12_4_ = fVar139 * pfVar4[3] + auVar112._12_4_;
                auVar104._16_4_ = fVar131 * pfVar4[4] + auVar112._16_4_;
                auVar104._20_4_ = fVar140 * pfVar4[5] + auVar112._20_4_;
                auVar104._24_4_ = fVar132 * pfVar4[6] + auVar112._24_4_;
                auVar104._28_4_ = pfVar3[7] + auVar112._28_4_;
                auVar112 = ZEXT3264(auVar104);
                lVar76 = lVar76 + 0x20;
                iVar28 = iVar28 + -1;
              } while (1 < iVar28);
              pvVar44 = (void *)(lVar76 + (long)pvVar38);
              local_320 = (void *)((long)local_170 + lVar76);
              local_298 = (void *)((long)local_178 + lVar76);
              local_238 = (void *)((long)pvVar61 + lVar76);
              pvVar69 = (void *)((long)pvVar59 + lVar76);
              local_318 = (void *)((long)pvVar74 + lVar76);
              local_308 = (void *)((long)pvVar72 + lVar76);
              pvVar77 = (void *)(lVar76 + (long)pvVar37);
              pvVar52 = (void *)((long)pvVar49 + lVar76);
            }
            auVar104 = vhaddps_avx(auVar147,auVar104);
            auVar135 = vhaddps_avx(auVar135,in_ZMM6._0_32_);
            in_ZMM5 = ZEXT3264(auVar135);
            auVar104 = vhaddps_avx(auVar135,auVar104);
            auVar115 = vhaddps_avx(auVar115,auVar126);
            auVar80 = vhaddps_avx(auVar80,auVar94);
            auVar94 = vhaddps_avx(auVar80,auVar115);
            auVar80 = vblendps_avx(auVar94,auVar104,0xf0);
            auVar93 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar71 + lVar5 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar71 + lVar5 * 4 + lVar31)),0x10);
            auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar71 + lVar5 * 4 + lVar31 * 2
                                                             )),0x20);
            auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar71 + lVar5 * 4 + lVar31 * 3
                                                             )),0x30);
            in_ZMM3 = ZEXT1664(auVar93);
            auVar94 = vperm2f128_avx(auVar94,auVar104,0x21);
            auVar149 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar71 + uVar48 * 8)),
                                     ZEXT416(*(uint *)((long)pvVar71 + uVar48 * 8 + lVar31)),0x10);
            auVar149 = vinsertps_avx(auVar149,ZEXT416(*(uint *)((long)pvVar71 +
                                                               uVar48 * 8 + lVar31 * 2)),0x20);
            auVar149 = vinsertps_avx(auVar149,ZEXT416(*(uint *)((long)pvVar71 +
                                                               uVar48 * 8 + lVar31 * 3)),0x30);
            auVar86 = ZEXT3264(CONCAT428(auVar80._28_4_ + auVar94._28_4_ + auVar93._12_4_,
                                         CONCAT424(auVar80._24_4_ + auVar94._24_4_ + auVar93._8_4_,
                                                   CONCAT420(auVar80._20_4_ + auVar94._20_4_ +
                                                             auVar93._4_4_,
                                                             CONCAT416(auVar80._16_4_ +
                                                                       auVar94._16_4_ +
                                                                       auVar93._0_4_,
                                                                       CONCAT412(auVar80._12_4_ +
                                                                                 auVar94._12_4_ +
                                                                                 auVar149._12_4_,
                                                                                 CONCAT48(auVar80.
                                                  _8_4_ + auVar94._8_4_ + auVar149._8_4_,
                                                  CONCAT44(auVar80._4_4_ + auVar94._4_4_ +
                                                           auVar149._4_4_,
                                                           auVar80._0_4_ + auVar94._0_4_ +
                                                           auVar149._0_4_))))))));
            if ((uVar8 & 7) != 0) {
              lVar76 = 0;
              iVar28 = iVar39;
              do {
                auVar93 = vinsertps_avx(ZEXT416(*(uint *)((long)local_198 + lVar76)),
                                        ZEXT416(*(uint *)((long)local_1a0 + lVar76)),0x10);
                auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar41 + lVar76)),0x20);
                auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar67 + lVar76)),0x30);
                auVar149 = vinsertps_avx(ZEXT416(*(uint *)((long)local_180 + lVar76)),
                                         ZEXT416(*(uint *)((long)local_188 + lVar76)),0x10);
                auVar149 = vinsertps_avx(auVar149,ZEXT416(*(uint *)((long)local_190 + lVar76)),0x20)
                ;
                auVar149 = vinsertps_avx(auVar149,ZEXT416(*(uint *)((long)pvVar62 + lVar76)),0x30);
                fVar124 = *(float *)((long)pvVar78 + lVar76);
                auVar86 = ZEXT3264(CONCAT428(auVar93._12_4_ + auVar86._28_4_,
                                             CONCAT424(auVar93._8_4_ * fVar124 + auVar86._24_4_,
                                                       CONCAT420(auVar93._4_4_ * fVar124 +
                                                                 auVar86._20_4_,
                                                                 CONCAT416(auVar93._0_4_ * fVar124 +
                                                                           auVar86._16_4_,
                                                                           CONCAT412(auVar149._12_4_
                                                                                     * fVar124 +
                                                                                     auVar86._12_4_,
                                                                                     CONCAT48(
                                                  auVar149._8_4_ * fVar124 + auVar86._8_4_,
                                                  CONCAT44(auVar149._4_4_ * fVar124 + auVar86._4_4_,
                                                           auVar149._0_4_ * fVar124 + auVar86._0_4_)
                                                  )))))));
                lVar76 = lVar76 + 4;
                iVar28 = iVar28 + -1;
              } while (1 < iVar28);
            }
            auVar81 = auVar86._0_32_;
            if ((_w & 7) != 0) {
              lVar76 = 0;
              iVar28 = iVar40;
              do {
                auVar93 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar69 + lVar76)),
                                        ZEXT416(*(uint *)((long)local_318 + lVar76)),0x10);
                auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)local_308 + lVar76)),0x20);
                auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar77 + lVar76)),0x30);
                auVar149 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar44 + lVar76)),
                                         ZEXT416(*(uint *)((long)local_320 + lVar76)),0x10);
                auVar149 = vinsertps_avx(auVar149,ZEXT416(*(uint *)((long)local_298 + lVar76)),0x20)
                ;
                auVar149 = vinsertps_avx(auVar149,ZEXT416(*(uint *)((long)local_238 + lVar76)),0x30)
                ;
                fVar124 = *(float *)((long)pvVar52 + lVar76);
                auVar81._0_4_ = auVar149._0_4_ * fVar124 + auVar86._0_4_;
                auVar81._4_4_ = auVar149._4_4_ * fVar124 + auVar86._4_4_;
                auVar81._8_4_ = auVar149._8_4_ * fVar124 + auVar86._8_4_;
                auVar81._12_4_ = auVar149._12_4_ * fVar124 + auVar86._12_4_;
                auVar81._16_4_ = auVar93._0_4_ * fVar124 + auVar86._16_4_;
                auVar81._20_4_ = auVar93._4_4_ * fVar124 + auVar86._20_4_;
                auVar81._24_4_ = auVar93._8_4_ * fVar124 + auVar86._24_4_;
                auVar81._28_4_ = auVar93._12_4_ + auVar86._28_4_;
                auVar86 = ZEXT3264(auVar81);
                lVar76 = lVar76 + 4;
                iVar28 = iVar28 + -1;
              } while (1 < iVar28);
            }
            *(int *)((long)local_78.data + uVar48 * 8) = auVar81._0_4_;
            auVar93 = auVar81._0_16_;
            uVar10 = vextractps_avx(auVar93,1);
            *(undefined4 *)((long)local_78.data + uVar48 * 8 + lVar32) = uVar10;
            uVar10 = vextractps_avx(auVar93,2);
            *(undefined4 *)((long)local_78.data + uVar48 * 8 + lVar32 * 2) = uVar10;
            uVar10 = vextractps_avx(auVar93,3);
            *(undefined4 *)((long)local_78.data + uVar48 * 8 + lVar32 * 3) = uVar10;
            auVar93 = auVar81._16_16_;
            *(int *)((long)local_78.data + lVar5 * 4) = auVar81._16_4_;
            uVar10 = vextractps_avx(auVar93,1);
            *(undefined4 *)((long)local_78.data + lVar5 * 4 + lVar32) = uVar10;
            uVar10 = vextractps_avx(auVar93,2);
            *(undefined4 *)((long)local_78.data + lVar5 * 4 + lVar32 * 2) = uVar10;
            uVar10 = vextractps_avx(auVar93,3);
            *(undefined4 *)((long)local_78.data + lVar5 * 4 + lVar32 * 3) = uVar10;
            uVar48 = uVar48 + 1;
            pvVar56 = (void *)((long)pvVar56 + lVar33);
            pvVar55 = (void *)((long)pvVar55 + lVar33);
            pvVar68 = (void *)((long)pvVar68 + lVar33);
            pvVar70 = (void *)((long)pvVar70 + lVar33);
            pvVar63 = (void *)((long)pvVar63 + lVar33);
            pvVar73 = (void *)((long)pvVar73 + lVar33);
            pvVar51 = (void *)((long)pvVar51 + lVar33);
            local_168 = (void *)((long)local_168 + lVar33);
            pvVar38 = (void *)((long)pvVar38 + lVar34);
            local_170 = (void *)((long)local_170 + lVar34);
            local_178 = (void *)((long)local_178 + lVar34);
            pvVar61 = (void *)((long)pvVar61 + lVar34);
            pvVar59 = (void *)((long)pvVar59 + lVar34);
            pvVar74 = (void *)((long)pvVar74 + lVar34);
            pvVar72 = (void *)((long)pvVar72 + lVar34);
            pvVar37 = (void *)((long)pvVar37 + lVar34);
          } while (uVar48 != (uint)((int)_w >> 1));
        }
        auVar146._8_4_ = 0x3f800000;
        auVar146._0_8_ = 0x3f8000003f800000;
        auVar146._12_4_ = 0x3f800000;
        auVar146._16_4_ = 0x3f800000;
        auVar146._20_4_ = 0x3f800000;
        auVar146._24_4_ = 0x3f800000;
        auVar146._28_4_ = 0x3f800000;
        if ((uint)uVar50 != _w) {
          pvVar45 = (void *)(bottom_blob->w * lVar30 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar63 = bias_c->data;
          lVar33 = (long)bias_c->w * bias_c->elemsize;
          lVar34 = (long)local_78.w * local_78.elemsize;
          lVar31 = (long)weight_xc->w * weight_xc->elemsize;
          lVar32 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar59 = weight_xc->data;
          pvVar47 = (void *)(lVar31 * (lVar36 + uVar50) + (long)pvVar59);
          pvVar61 = (void *)(lVar31 * (lVar29 + uVar50) + (long)pvVar59);
          pvVar49 = (void *)(lVar31 * (uVar58 + uVar50) + (long)pvVar59);
          pvVar73 = (void *)(lVar31 * uVar50 + (long)pvVar59);
          pvVar71 = weight_hc->data;
          pvVar51 = (void *)(lVar32 * (lVar36 + uVar50) + (long)pvVar71);
          pvVar38 = (void *)(lVar32 * (lVar29 + uVar50) + (long)pvVar71);
          pvVar37 = (void *)(lVar32 * (uVar58 + uVar50) + (long)pvVar71);
          pvVar56 = (void *)(lVar32 * uVar50 + (long)pvVar71);
          pvVar11 = hidden_state->data;
          uVar48 = uVar50;
          do {
            lVar43 = uVar48 + uVar58 * 2;
            lVar64 = uVar48 + uVar58 * 3;
            if (iVar54 < 1) {
              pvVar74 = (void *)(lVar31 * uVar48 + (long)pvVar59);
              pvVar70 = (void *)(lVar31 * (uVar48 + uVar58) + (long)pvVar59);
              pvVar68 = (void *)(lVar31 * lVar43 + (long)pvVar59);
              pvVar55 = (void *)(lVar31 * lVar64 + (long)pvVar59);
              auVar101 = ZEXT864(0);
              auVar112 = ZEXT864(0);
              in_ZMM3 = ZEXT864(0);
              auVar86 = ZEXT864(0);
              pvVar72 = pvVar45;
            }
            else {
              auVar86 = ZEXT864(0);
              lVar76 = 0;
              in_ZMM3 = ZEXT864(0);
              auVar112 = ZEXT864(0);
              auVar101 = ZEXT864(0);
              auVar123 = in_ZMM6;
              iVar28 = iVar54 + 1;
              do {
                pfVar3 = (float *)((long)pvVar45 + lVar76);
                fVar124 = *pfVar3;
                fVar134 = pfVar3[1];
                fVar130 = pfVar3[2];
                fVar139 = pfVar3[3];
                fVar131 = pfVar3[4];
                fVar140 = pfVar3[5];
                fVar132 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar73 + lVar76);
                fVar133 = in_ZMM5._28_4_;
                auVar101 = ZEXT3264(CONCAT428(fVar133 + auVar101._28_4_,
                                              CONCAT424(fVar132 * pfVar4[6] + auVar101._24_4_,
                                                        CONCAT420(fVar140 * pfVar4[5] +
                                                                  auVar101._20_4_,
                                                                  CONCAT416(fVar131 * pfVar4[4] +
                                                                            auVar101._16_4_,
                                                                            CONCAT412(fVar139 * 
                                                  pfVar4[3] + auVar101._12_4_,
                                                  CONCAT48(fVar130 * pfVar4[2] + auVar101._8_4_,
                                                           CONCAT44(fVar134 * pfVar4[1] +
                                                                    auVar101._4_4_,
                                                                    fVar124 * *pfVar4 +
                                                                    auVar101._0_4_))))))));
                pfVar4 = (float *)((long)pvVar49 + lVar76);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar133,CONCAT424(fVar132 * pfVar4[6],
                                                               CONCAT420(fVar140 * pfVar4[5],
                                                                         CONCAT416(fVar131 * pfVar4[
                                                  4],CONCAT412(fVar139 * pfVar4[3],
                                                               CONCAT48(fVar130 * pfVar4[2],
                                                                        CONCAT44(fVar134 * pfVar4[1]
                                                                                 ,fVar124 * *pfVar4)
                                                                       )))))));
                pfVar7 = (float *)((long)pvVar61 + lVar76);
                auVar129._0_4_ = fVar124 * *pfVar7;
                auVar129._4_4_ = fVar134 * pfVar7[1];
                auVar129._8_4_ = fVar130 * pfVar7[2];
                auVar129._12_4_ = fVar139 * pfVar7[3];
                auVar129._16_4_ = fVar131 * pfVar7[4];
                auVar129._20_4_ = fVar140 * pfVar7[5];
                auVar129._28_36_ = auVar123._28_36_;
                auVar129._24_4_ = fVar132 * pfVar7[6];
                in_ZMM6 = ZEXT3264(auVar129._0_32_);
                auVar112 = ZEXT3264(CONCAT428(fVar133 + auVar112._28_4_,
                                              CONCAT424(fVar132 * pfVar4[6] + auVar112._24_4_,
                                                        CONCAT420(fVar140 * pfVar4[5] +
                                                                  auVar112._20_4_,
                                                                  CONCAT416(fVar131 * pfVar4[4] +
                                                                            auVar112._16_4_,
                                                                            CONCAT412(fVar139 * 
                                                  pfVar4[3] + auVar112._12_4_,
                                                  CONCAT48(fVar130 * pfVar4[2] + auVar112._8_4_,
                                                           CONCAT44(fVar134 * pfVar4[1] +
                                                                    auVar112._4_4_,
                                                                    fVar124 * *pfVar4 +
                                                                    auVar112._0_4_))))))));
                in_ZMM3 = ZEXT3264(CONCAT428(auVar123._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar129._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar129._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar129._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar129._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar129._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar129._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar129._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)pvVar47 + lVar76);
                auVar86 = ZEXT3264(CONCAT428(pfVar3[7] + auVar86._28_4_,
                                             CONCAT424(fVar132 * pfVar4[6] + auVar86._24_4_,
                                                       CONCAT420(fVar140 * pfVar4[5] +
                                                                 auVar86._20_4_,
                                                                 CONCAT416(fVar131 * pfVar4[4] +
                                                                           auVar86._16_4_,
                                                                           CONCAT412(fVar139 * 
                                                  pfVar4[3] + auVar86._12_4_,
                                                  CONCAT48(fVar130 * pfVar4[2] + auVar86._8_4_,
                                                           CONCAT44(fVar134 * pfVar4[1] +
                                                                    auVar86._4_4_,
                                                                    fVar124 * *pfVar4 +
                                                                    auVar86._0_4_))))))));
                iVar28 = iVar28 + -1;
                lVar76 = lVar76 + 0x20;
                auVar123 = in_ZMM6;
              } while (1 < iVar28);
              pvVar55 = (void *)((long)pvVar47 + lVar76);
              pvVar68 = (void *)(lVar76 + (long)pvVar61);
              pvVar70 = (void *)(lVar76 + (long)pvVar49);
              pvVar74 = (void *)((long)pvVar73 + lVar76);
              pvVar72 = (void *)(lVar76 + (long)pvVar45);
            }
            auVar105 = auVar112._0_32_;
            auVar95 = auVar101._0_32_;
            auVar82 = auVar86._0_32_;
            if (iVar60 < 1) {
              pvVar67 = (void *)(lVar32 * uVar48 + (long)pvVar71);
              pvVar78 = (void *)((uVar48 + uVar58) * lVar32 + (long)pvVar71);
              pvVar62 = (void *)(lVar43 * lVar32 + (long)pvVar71);
              pvVar41 = (void *)(lVar64 * lVar32 + (long)pvVar71);
              pvVar44 = pvVar11;
            }
            else {
              lVar43 = 0;
              auVar123 = in_ZMM6;
              iVar28 = iVar60 + 1;
              do {
                pfVar3 = (float *)((long)pvVar11 + lVar43);
                fVar124 = *pfVar3;
                fVar134 = pfVar3[1];
                fVar130 = pfVar3[2];
                fVar139 = pfVar3[3];
                fVar131 = pfVar3[4];
                fVar140 = pfVar3[5];
                fVar132 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar56 + lVar43);
                auVar95._0_4_ = fVar124 * *pfVar4 + auVar101._0_4_;
                auVar95._4_4_ = fVar134 * pfVar4[1] + auVar101._4_4_;
                auVar95._8_4_ = fVar130 * pfVar4[2] + auVar101._8_4_;
                auVar95._12_4_ = fVar139 * pfVar4[3] + auVar101._12_4_;
                auVar95._16_4_ = fVar131 * pfVar4[4] + auVar101._16_4_;
                auVar95._20_4_ = fVar140 * pfVar4[5] + auVar101._20_4_;
                auVar95._24_4_ = fVar132 * pfVar4[6] + auVar101._24_4_;
                fVar133 = in_ZMM5._28_4_;
                auVar95._28_4_ = fVar133 + auVar101._28_4_;
                auVar101 = ZEXT3264(auVar95);
                pfVar4 = (float *)((long)pvVar37 + lVar43);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar133,CONCAT424(fVar132 * pfVar4[6],
                                                               CONCAT420(fVar140 * pfVar4[5],
                                                                         CONCAT416(fVar131 * pfVar4[
                                                  4],CONCAT412(fVar139 * pfVar4[3],
                                                               CONCAT48(fVar130 * pfVar4[2],
                                                                        CONCAT44(fVar134 * pfVar4[1]
                                                                                 ,fVar124 * *pfVar4)
                                                                       )))))));
                pfVar7 = (float *)((long)pvVar38 + lVar43);
                auVar138._0_4_ = fVar124 * *pfVar7;
                auVar138._4_4_ = fVar134 * pfVar7[1];
                auVar138._8_4_ = fVar130 * pfVar7[2];
                auVar138._12_4_ = fVar139 * pfVar7[3];
                auVar138._16_4_ = fVar131 * pfVar7[4];
                auVar138._20_4_ = fVar140 * pfVar7[5];
                auVar138._28_36_ = auVar123._28_36_;
                auVar138._24_4_ = fVar132 * pfVar7[6];
                in_ZMM6 = ZEXT3264(auVar138._0_32_);
                auVar105._0_4_ = fVar124 * *pfVar4 + auVar112._0_4_;
                auVar105._4_4_ = fVar134 * pfVar4[1] + auVar112._4_4_;
                auVar105._8_4_ = fVar130 * pfVar4[2] + auVar112._8_4_;
                auVar105._12_4_ = fVar139 * pfVar4[3] + auVar112._12_4_;
                auVar105._16_4_ = fVar131 * pfVar4[4] + auVar112._16_4_;
                auVar105._20_4_ = fVar140 * pfVar4[5] + auVar112._20_4_;
                auVar105._24_4_ = fVar132 * pfVar4[6] + auVar112._24_4_;
                auVar105._28_4_ = fVar133 + auVar112._28_4_;
                auVar112 = ZEXT3264(auVar105);
                in_ZMM3 = ZEXT3264(CONCAT428(auVar123._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar138._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar138._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar138._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar138._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar138._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar138._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar138._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)pvVar51 + lVar43);
                auVar82._0_4_ = fVar124 * *pfVar4 + auVar86._0_4_;
                auVar82._4_4_ = fVar134 * pfVar4[1] + auVar86._4_4_;
                auVar82._8_4_ = fVar130 * pfVar4[2] + auVar86._8_4_;
                auVar82._12_4_ = fVar139 * pfVar4[3] + auVar86._12_4_;
                auVar82._16_4_ = fVar131 * pfVar4[4] + auVar86._16_4_;
                auVar82._20_4_ = fVar140 * pfVar4[5] + auVar86._20_4_;
                auVar82._24_4_ = fVar132 * pfVar4[6] + auVar86._24_4_;
                auVar82._28_4_ = pfVar3[7] + auVar86._28_4_;
                auVar86 = ZEXT3264(auVar82);
                iVar28 = iVar28 + -1;
                lVar43 = lVar43 + 0x20;
                auVar123 = in_ZMM6;
              } while (1 < iVar28);
              pvVar41 = (void *)((long)pvVar51 + lVar43);
              pvVar62 = (void *)((long)pvVar38 + lVar43);
              pvVar78 = (void *)((long)pvVar37 + lVar43);
              pvVar67 = (void *)((long)pvVar56 + lVar43);
              pvVar44 = (void *)(lVar43 + (long)pvVar11);
            }
            auVar80 = vhaddps_avx(in_ZMM3._0_32_,auVar82);
            auVar94 = vhaddps_avx(auVar95,auVar105);
            auVar80 = vhaddps_avx(auVar94,auVar80);
            auVar93 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar63 + uVar48 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar63 + uVar48 * 4 + lVar33)),0x10);
            auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar63 +
                                                             uVar48 * 4 + lVar33 * 2)),0x20);
            auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar63 +
                                                             uVar48 * 4 + lVar33 * 3)),0x30);
            auVar86 = ZEXT1664(CONCAT412(auVar93._12_4_ + auVar80._12_4_ + auVar80._28_4_,
                                         CONCAT48(auVar93._8_4_ + auVar80._8_4_ + auVar80._24_4_,
                                                  CONCAT44(auVar93._4_4_ + auVar80._4_4_ +
                                                           auVar80._20_4_,
                                                           auVar93._0_4_ + auVar80._0_4_ +
                                                           auVar80._16_4_))));
            if ((uVar8 & 7) != 0) {
              lVar43 = 0;
              iVar28 = iVar39;
              do {
                auVar93 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar74 + lVar43)),
                                        ZEXT416(*(uint *)((long)pvVar70 + lVar43)),0x10);
                auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar68 + lVar43)),0x20);
                auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar55 + lVar43)),0x30);
                fVar124 = *(float *)((long)pvVar72 + lVar43);
                auVar86 = ZEXT1664(CONCAT412(auVar93._12_4_ * fVar124 + auVar86._12_4_,
                                             CONCAT48(auVar93._8_4_ * fVar124 + auVar86._8_4_,
                                                      CONCAT44(auVar93._4_4_ * fVar124 +
                                                               auVar86._4_4_,
                                                               auVar93._0_4_ * fVar124 +
                                                               auVar86._0_4_))));
                iVar28 = iVar28 + -1;
                lVar43 = lVar43 + 4;
              } while (1 < iVar28);
            }
            auVar93 = auVar86._0_16_;
            if ((uVar58 & 7) != 0) {
              lVar43 = 0;
              iVar28 = iVar40;
              do {
                auVar93 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar67 + lVar43)),
                                        ZEXT416(*(uint *)((long)pvVar78 + lVar43)),0x10);
                auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar62 + lVar43)),0x20);
                auVar149 = vinsertps_avx(auVar93,ZEXT416(*(uint *)((long)pvVar41 + lVar43)),0x30);
                fVar124 = *(float *)((long)pvVar44 + lVar43);
                auVar93._0_4_ = auVar149._0_4_ * fVar124 + auVar86._0_4_;
                auVar93._4_4_ = auVar149._4_4_ * fVar124 + auVar86._4_4_;
                auVar93._8_4_ = auVar149._8_4_ * fVar124 + auVar86._8_4_;
                auVar93._12_4_ = auVar149._12_4_ * fVar124 + auVar86._12_4_;
                auVar86 = ZEXT1664(auVar93);
                iVar28 = iVar28 + -1;
                lVar43 = lVar43 + 4;
              } while (1 < iVar28);
            }
            *(int *)((long)local_78.data + uVar48 * 4) = auVar93._0_4_;
            uVar10 = vextractps_avx(auVar93,1);
            *(undefined4 *)((long)local_78.data + uVar48 * 4 + lVar34) = uVar10;
            uVar10 = vextractps_avx(auVar93,2);
            *(undefined4 *)((long)local_78.data + uVar48 * 4 + lVar34 * 2) = uVar10;
            uVar10 = vextractps_avx(auVar93,3);
            *(undefined4 *)((long)local_78.data + uVar48 * 4 + lVar34 * 3) = uVar10;
            uVar48 = uVar48 + 1;
            pvVar47 = (void *)((long)pvVar47 + lVar31);
            pvVar61 = (void *)((long)pvVar61 + lVar31);
            pvVar49 = (void *)((long)pvVar49 + lVar31);
            pvVar73 = (void *)((long)pvVar73 + lVar31);
            pvVar51 = (void *)((long)pvVar51 + lVar32);
            pvVar38 = (void *)((long)pvVar38 + lVar32);
            pvVar37 = (void *)((long)pvVar37 + lVar32);
            pvVar56 = (void *)((long)pvVar56 + lVar32);
          } while ((long)uVar48 < (long)uVar58);
        }
        pvVar71 = (void *)(top_blob->w * lVar30 * top_blob->elemsize + (long)top_blob->data);
        lVar30 = (long)local_78.w * local_78.elemsize;
        pAVar42 = (Allocator *)((long)local_78.data + lVar30);
        pAVar53 = (Allocator *)((long)local_78.data + lVar30 * 3);
        pvVar63 = cell_state->data;
        pvVar59 = hidden_state->data;
        pAVar46 = (Allocator *)((long)local_78.data + lVar30 * 2);
        pAVar57 = (Allocator *)local_78.data;
        if (0 < iVar60) {
          lVar30 = 0;
          auVar149._8_4_ = 0x3f800000;
          auVar149._0_8_ = 0x3f8000003f800000;
          auVar149._12_4_ = 0x3f800000;
          in_ZMM9 = ZEXT1664(auVar149);
          iVar28 = iVar60 + 1;
          do {
            auVar80 = *(undefined1 (*) [32])((long)local_78.data + lVar30);
            auVar83._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
            auVar83._8_4_ = auVar80._8_4_ ^ 0x80000000;
            auVar83._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar83._16_4_ = auVar80._16_4_ ^ 0x80000000;
            auVar83._20_4_ = auVar80._20_4_ ^ 0x80000000;
            auVar83._24_4_ = auVar80._24_4_ ^ 0x80000000;
            auVar83._28_4_ = auVar80._28_4_ ^ 0x80000000;
            auVar150._8_4_ = 0x42b0c0a5;
            auVar150._0_8_ = 0x42b0c0a542b0c0a5;
            auVar150._12_4_ = 0x42b0c0a5;
            auVar150._16_4_ = 0x42b0c0a5;
            auVar150._20_4_ = 0x42b0c0a5;
            auVar150._24_4_ = 0x42b0c0a5;
            auVar150._28_4_ = 0x42b0c0a5;
            in_ZMM10 = ZEXT3264(auVar150);
            auVar80 = vminps_avx(auVar150,auVar83);
            auVar96._8_4_ = 0xc2b0c0a5;
            auVar96._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar96._12_4_ = 0xc2b0c0a5;
            auVar96._16_4_ = 0xc2b0c0a5;
            auVar96._20_4_ = 0xc2b0c0a5;
            auVar96._24_4_ = 0xc2b0c0a5;
            auVar96._28_4_ = 0xc2b0c0a5;
            auVar94 = vmaxps_avx(auVar80,auVar96);
            auVar97._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
            auVar97._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
            auVar97._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
            auVar97._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
            auVar97._16_4_ = auVar94._16_4_ * 1.442695 + 0.5;
            auVar97._20_4_ = auVar94._20_4_ * 1.442695 + 0.5;
            auVar97._24_4_ = auVar94._24_4_ * 1.442695 + 0.5;
            auVar97._28_4_ = 0xc2afc0a5;
            auVar104 = vroundps_avx(auVar97,1);
            auVar80 = vcmpps_avx(auVar97,auVar104,1);
            auVar80 = vandps_avx(auVar80,auVar146);
            auVar80 = vsubps_avx(auVar104,auVar80);
            auVar14._4_4_ = auVar80._4_4_ * 0.6931472;
            auVar14._0_4_ = auVar80._0_4_ * 0.6931472;
            auVar14._8_4_ = auVar80._8_4_ * 0.6931472;
            auVar14._12_4_ = auVar80._12_4_ * 0.6931472;
            auVar14._16_4_ = auVar80._16_4_ * 0.6931472;
            auVar14._20_4_ = auVar80._20_4_ * 0.6931472;
            auVar14._24_4_ = auVar80._24_4_ * 0.6931472;
            auVar14._28_4_ = auVar104._28_4_;
            auVar94 = vsubps_avx(auVar94,auVar14);
            fVar124 = auVar94._0_4_;
            fVar134 = auVar94._4_4_;
            fVar130 = auVar94._8_4_;
            fVar139 = auVar94._12_4_;
            fVar131 = auVar94._16_4_;
            fVar140 = auVar94._20_4_;
            fVar132 = auVar94._24_4_;
            auVar102._0_4_ = (int)auVar80._0_4_;
            auVar102._4_4_ = (int)auVar80._4_4_;
            auVar102._8_4_ = (int)auVar80._8_4_;
            auVar102._12_4_ = (int)auVar80._12_4_;
            auVar98._16_4_ = (int)auVar80._16_4_;
            auVar98._0_16_ = auVar102;
            auVar98._20_4_ = (int)auVar80._20_4_;
            auVar98._24_4_ = (int)auVar80._24_4_;
            auVar98._28_4_ = (int)auVar80._28_4_;
            auVar102 = vpslld_avx(auVar102,0x17);
            auVar93 = vpslld_avx(auVar98._16_16_,0x17);
            auVar93 = vpaddd_avx(auVar149,auVar93);
            auVar102 = vpaddd_avx(auVar149,auVar102);
            auVar106._0_4_ =
                 (fVar124 + 1.0 +
                 fVar124 * fVar124 *
                 (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                   0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5)) * auVar102._0_4_ + 1.0;
            auVar106._4_4_ =
                 (fVar134 + 1.0 +
                 fVar134 * fVar134 *
                 (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5)) * auVar102._4_4_ + 1.0;
            auVar106._8_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar102._8_4_ + 1.0;
            auVar106._12_4_ =
                 (fVar139 + 1.0 +
                 fVar139 * fVar139 *
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar102._12_4_ + 1.0;
            auVar106._16_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar93._0_4_ + 1.0;
            auVar106._20_4_ =
                 (fVar140 + 1.0 +
                 fVar140 * fVar140 *
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar93._4_4_ + 1.0;
            auVar106._24_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar93._8_4_ + 1.0;
            auVar106._28_4_ = auVar94._28_4_ + 1.0 + auVar104._28_4_ + 1.0;
            auVar104 = vrcpps_avx(auVar106);
            pAVar57 = pAVar53 + lVar30;
            auVar15._4_4_ = *(float *)(pAVar57 + 4) * -2.0;
            auVar15._0_4_ = *(float *)pAVar57 * -2.0;
            auVar15._8_4_ = *(float *)(pAVar57 + 8) * -2.0;
            auVar15._12_4_ = *(float *)(pAVar57 + 0xc) * -2.0;
            auVar15._16_4_ = *(float *)(pAVar57 + 0x10) * -2.0;
            auVar15._20_4_ = *(float *)(pAVar57 + 0x14) * -2.0;
            auVar15._24_4_ = *(float *)(pAVar57 + 0x18) * -2.0;
            auVar15._28_4_ = 0xc0000000;
            auVar80 = vminps_avx(auVar150,auVar15);
            auVar94 = vmaxps_avx(auVar80,auVar96);
            auVar116._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
            auVar116._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
            auVar116._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
            auVar116._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
            auVar116._16_4_ = auVar94._16_4_ * 1.442695 + 0.5;
            auVar116._20_4_ = auVar94._20_4_ * 1.442695 + 0.5;
            auVar116._24_4_ = auVar94._24_4_ * 1.442695 + 0.5;
            auVar116._28_4_ =
                 in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 0.5;
            auVar115 = vroundps_avx(auVar116,1);
            auVar80 = vcmpps_avx(auVar116,auVar115,1);
            auVar80 = vandps_avx(auVar80,auVar146);
            auVar80 = vsubps_avx(auVar115,auVar80);
            auVar16._4_4_ = auVar80._4_4_ * 0.6931472;
            auVar16._0_4_ = auVar80._0_4_ * 0.6931472;
            auVar16._8_4_ = auVar80._8_4_ * 0.6931472;
            auVar16._12_4_ = auVar80._12_4_ * 0.6931472;
            auVar16._16_4_ = auVar80._16_4_ * 0.6931472;
            auVar16._20_4_ = auVar80._20_4_ * 0.6931472;
            auVar16._24_4_ = auVar80._24_4_ * 0.6931472;
            auVar16._28_4_ = auVar115._28_4_;
            auVar94 = vsubps_avx(auVar94,auVar16);
            fVar124 = auVar94._0_4_;
            fVar134 = auVar94._4_4_;
            fVar130 = auVar94._8_4_;
            fVar139 = auVar94._12_4_;
            fVar131 = auVar94._16_4_;
            fVar140 = auVar94._20_4_;
            fVar132 = auVar94._24_4_;
            auVar113._0_4_ = (int)auVar80._0_4_;
            auVar113._4_4_ = (int)auVar80._4_4_;
            auVar113._8_4_ = (int)auVar80._8_4_;
            auVar113._12_4_ = (int)auVar80._12_4_;
            auVar117._16_4_ = (int)auVar80._16_4_;
            auVar117._0_16_ = auVar113;
            auVar117._20_4_ = (int)auVar80._20_4_;
            auVar117._24_4_ = (int)auVar80._24_4_;
            auVar117._28_4_ = (int)auVar80._28_4_;
            auVar102 = vpslld_avx(auVar113,0x17);
            auVar93 = vpslld_avx(auVar117._16_16_,0x17);
            auVar93 = vpaddd_avx(auVar149,auVar93);
            auVar102 = vpaddd_avx(auVar149,auVar102);
            auVar84._0_4_ =
                 (fVar124 + 1.0 +
                 fVar124 * fVar124 *
                 (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                   0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5)) * auVar102._0_4_ + 1.0;
            auVar84._4_4_ =
                 (fVar134 + 1.0 +
                 fVar134 * fVar134 *
                 (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5)) * auVar102._4_4_ + 1.0;
            auVar84._8_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar102._8_4_ + 1.0;
            auVar84._12_4_ =
                 (fVar139 + 1.0 +
                 fVar139 * fVar139 *
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar102._12_4_ + 1.0;
            auVar84._16_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar93._0_4_ + 1.0;
            auVar84._20_4_ =
                 (fVar140 + 1.0 +
                 fVar140 * fVar140 *
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar93._4_4_ + 1.0;
            auVar84._24_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar93._8_4_ + 1.0;
            auVar84._28_4_ = auVar94._28_4_ + 1.0 + auVar115._28_4_ + 1.0;
            auVar80 = vrcpps_avx(auVar84);
            fVar124 = auVar80._0_4_;
            fVar134 = auVar80._4_4_;
            fVar130 = auVar80._8_4_;
            fVar139 = auVar80._12_4_;
            fVar131 = auVar80._16_4_;
            fVar140 = auVar80._20_4_;
            fVar132 = auVar80._24_4_;
            auVar17._4_4_ = auVar84._4_4_ * (fVar134 + fVar134);
            auVar17._0_4_ = auVar84._0_4_ * (fVar124 + fVar124);
            auVar17._8_4_ = auVar84._8_4_ * (fVar130 + fVar130);
            auVar17._12_4_ = auVar84._12_4_ * (fVar139 + fVar139);
            auVar17._16_4_ = auVar84._16_4_ * (fVar131 + fVar131);
            auVar17._20_4_ = auVar84._20_4_ * (fVar140 + fVar140);
            auVar17._24_4_ = auVar84._24_4_ * (fVar132 + fVar132);
            auVar17._28_4_ = auVar84._28_4_;
            auVar136._8_4_ = 0x40000000;
            auVar136._0_8_ = 0x4000000040000000;
            auVar136._12_4_ = 0x40000000;
            auVar136._16_4_ = 0x40000000;
            auVar136._20_4_ = 0x40000000;
            auVar136._24_4_ = 0x40000000;
            auVar136._28_4_ = 0x40000000;
            auVar94 = vsubps_avx(auVar136,auVar17);
            fVar133 = auVar94._28_4_;
            auVar118._0_4_ = fVar124 + fVar124 + -1.0 + fVar124 * auVar94._0_4_;
            auVar118._4_4_ = fVar134 + fVar134 + -1.0 + fVar134 * auVar94._4_4_;
            auVar118._8_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar94._8_4_;
            auVar118._12_4_ = fVar139 + fVar139 + -1.0 + fVar139 * auVar94._12_4_;
            auVar118._16_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar94._16_4_;
            auVar118._20_4_ = fVar140 + fVar140 + -1.0 + fVar140 * auVar94._20_4_;
            auVar118._24_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar94._24_4_;
            auVar118._28_4_ = auVar80._28_4_ + auVar80._28_4_ + -1.0 + fVar133;
            fVar79 = auVar118._0_4_ * auVar104._0_4_;
            fVar87 = auVar118._4_4_ * auVar104._4_4_;
            fVar88 = auVar118._8_4_ * auVar104._8_4_;
            fVar89 = auVar118._12_4_ * auVar104._12_4_;
            fVar90 = auVar118._16_4_ * auVar104._16_4_;
            fVar91 = auVar118._20_4_ * auVar104._20_4_;
            fVar92 = auVar118._24_4_ * auVar104._24_4_;
            auVar18._4_4_ = auVar106._4_4_ * fVar87;
            auVar18._0_4_ = auVar106._0_4_ * fVar79;
            auVar18._8_4_ = auVar106._8_4_ * fVar88;
            auVar18._12_4_ = auVar106._12_4_ * fVar89;
            auVar18._16_4_ = auVar106._16_4_ * fVar90;
            auVar18._20_4_ = auVar106._20_4_ * fVar91;
            auVar18._24_4_ = auVar106._24_4_ * fVar92;
            auVar18._28_4_ = auVar106._28_4_;
            auVar135 = vsubps_avx(auVar118,auVar18);
            auVar80 = *(undefined1 (*) [32])(pAVar42 + lVar30);
            auVar107._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
            auVar107._8_4_ = auVar80._8_4_ ^ 0x80000000;
            auVar107._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar107._16_4_ = auVar80._16_4_ ^ 0x80000000;
            auVar107._20_4_ = auVar80._20_4_ ^ 0x80000000;
            auVar107._24_4_ = auVar80._24_4_ ^ 0x80000000;
            auVar107._28_4_ = auVar80._28_4_ ^ 0x80000000;
            auVar80 = vminps_avx(auVar150,auVar107);
            auVar145._8_4_ = 0xc2b0c0a5;
            auVar145._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar145._12_4_ = 0xc2b0c0a5;
            auVar145._16_4_ = 0xc2b0c0a5;
            auVar145._20_4_ = 0xc2b0c0a5;
            auVar145._24_4_ = 0xc2b0c0a5;
            auVar145._28_4_ = 0xc2b0c0a5;
            auVar94 = vmaxps_avx(auVar80,auVar145);
            auVar119._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
            auVar119._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
            auVar119._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
            auVar119._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
            auVar119._16_4_ = auVar94._16_4_ * 1.442695 + 0.5;
            auVar119._20_4_ = auVar94._20_4_ * 1.442695 + 0.5;
            auVar119._24_4_ = auVar94._24_4_ * 1.442695 + 0.5;
            auVar119._28_4_ = auVar118._28_4_ + 0.5;
            auVar115 = vroundps_avx(auVar119,1);
            auVar80 = vcmpps_avx(auVar119,auVar115,1);
            auVar80 = vandps_avx(auVar80,auVar146);
            auVar80 = vsubps_avx(auVar115,auVar80);
            auVar19._4_4_ = auVar80._4_4_ * 0.6931472;
            auVar19._0_4_ = auVar80._0_4_ * 0.6931472;
            auVar19._8_4_ = auVar80._8_4_ * 0.6931472;
            auVar19._12_4_ = auVar80._12_4_ * 0.6931472;
            auVar19._16_4_ = auVar80._16_4_ * 0.6931472;
            auVar19._20_4_ = auVar80._20_4_ * 0.6931472;
            auVar19._24_4_ = auVar80._24_4_ * 0.6931472;
            auVar19._28_4_ = auVar115._28_4_;
            auVar94 = vsubps_avx(auVar94,auVar19);
            fVar124 = auVar94._0_4_;
            fVar134 = auVar94._4_4_;
            fVar130 = auVar94._8_4_;
            fVar139 = auVar94._12_4_;
            fVar131 = auVar94._16_4_;
            fVar140 = auVar94._20_4_;
            fVar132 = auVar94._24_4_;
            auVar114._0_4_ = (int)auVar80._0_4_;
            auVar114._4_4_ = (int)auVar80._4_4_;
            auVar114._8_4_ = (int)auVar80._8_4_;
            auVar114._12_4_ = (int)auVar80._12_4_;
            auVar120._16_4_ = (int)auVar80._16_4_;
            auVar120._0_16_ = auVar114;
            auVar120._20_4_ = (int)auVar80._20_4_;
            auVar120._24_4_ = (int)auVar80._24_4_;
            auVar120._28_4_ = (int)auVar80._28_4_;
            auVar102 = vpslld_avx(auVar114,0x17);
            auVar93 = vpslld_avx(auVar120._16_16_,0x17);
            auVar93 = vpaddd_avx(auVar149,auVar93);
            auVar102 = vpaddd_avx(auVar149,auVar102);
            auVar108._0_4_ =
                 (fVar124 + 1.0 +
                 fVar124 * fVar124 *
                 (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                   0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5)) * auVar102._0_4_ + 1.0;
            auVar108._4_4_ =
                 (fVar134 + 1.0 +
                 fVar134 * fVar134 *
                 (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5)) * auVar102._4_4_ + 1.0;
            auVar108._8_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar102._8_4_ + 1.0;
            auVar108._12_4_ =
                 (fVar139 + 1.0 +
                 fVar139 * fVar139 *
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar102._12_4_ + 1.0;
            auVar108._16_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar93._0_4_ + 1.0;
            auVar108._20_4_ =
                 (fVar140 + 1.0 +
                 fVar140 * fVar140 *
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar93._4_4_ + 1.0;
            auVar108._24_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar93._8_4_ + 1.0;
            auVar108._28_4_ = auVar94._28_4_ + 1.0 + auVar115._28_4_ + 1.0;
            auVar115 = vrcpps_avx(auVar108);
            auVar80 = *(undefined1 (*) [32])((long)pvVar63 + lVar30);
            fVar134 = auVar80._0_4_ * auVar115._0_4_;
            fVar139 = auVar80._4_4_ * auVar115._4_4_;
            fVar140 = auVar80._8_4_ * auVar115._8_4_;
            fVar141 = auVar80._12_4_ * auVar115._12_4_;
            fVar142 = auVar80._16_4_ * auVar115._16_4_;
            fVar143 = auVar80._20_4_ * auVar115._20_4_;
            fVar144 = auVar80._24_4_ * auVar115._24_4_;
            auVar20._4_4_ = auVar108._4_4_ * fVar139;
            auVar20._0_4_ = auVar108._0_4_ * fVar134;
            auVar20._8_4_ = auVar108._8_4_ * fVar140;
            auVar20._12_4_ = auVar108._12_4_ * fVar141;
            auVar20._16_4_ = auVar108._16_4_ * fVar142;
            auVar20._20_4_ = auVar108._20_4_ * fVar143;
            auVar20._24_4_ = auVar108._24_4_ * fVar144;
            auVar20._28_4_ = auVar108._28_4_;
            auVar147 = vsubps_avx(auVar80,auVar20);
            auVar94 = *(undefined1 (*) [32])(pAVar46 + lVar30);
            auVar121._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
            auVar121._8_4_ = auVar94._8_4_ ^ 0x80000000;
            auVar121._12_4_ = auVar94._12_4_ ^ 0x80000000;
            auVar121._16_4_ = auVar94._16_4_ ^ 0x80000000;
            auVar121._20_4_ = auVar94._20_4_ ^ 0x80000000;
            auVar121._24_4_ = auVar94._24_4_ ^ 0x80000000;
            auVar121._28_4_ = auVar94._28_4_ ^ 0x80000000;
            auVar94 = vminps_avx(auVar150,auVar121);
            auVar94 = vmaxps_avx(auVar94,auVar145);
            auVar127._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
            auVar127._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
            auVar127._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
            auVar127._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
            auVar127._16_4_ = auVar94._16_4_ * 1.442695 + 0.5;
            auVar127._20_4_ = auVar94._20_4_ * 1.442695 + 0.5;
            auVar127._24_4_ = auVar94._24_4_ * 1.442695 + 0.5;
            auVar127._28_4_ = auVar80._28_4_ + 0.5;
            auVar126 = vroundps_avx(auVar127,1);
            auVar80 = vcmpps_avx(auVar127,auVar126,1);
            auVar80 = vandps_avx(auVar80,auVar146);
            auVar80 = vsubps_avx(auVar126,auVar80);
            auVar21._4_4_ = auVar80._4_4_ * 0.6931472;
            auVar21._0_4_ = auVar80._0_4_ * 0.6931472;
            auVar21._8_4_ = auVar80._8_4_ * 0.6931472;
            auVar21._12_4_ = auVar80._12_4_ * 0.6931472;
            auVar21._16_4_ = auVar80._16_4_ * 0.6931472;
            auVar21._20_4_ = auVar80._20_4_ * 0.6931472;
            auVar21._24_4_ = auVar80._24_4_ * 0.6931472;
            auVar21._28_4_ = auVar126._28_4_;
            auVar81 = vsubps_avx(auVar94,auVar21);
            fVar124 = auVar81._0_4_;
            fVar130 = auVar81._4_4_;
            fVar131 = auVar81._8_4_;
            fVar132 = auVar81._12_4_;
            fVar151 = auVar81._16_4_;
            fVar12 = auVar81._20_4_;
            fVar13 = auVar81._24_4_;
            auVar125._0_4_ = (int)auVar80._0_4_;
            auVar125._4_4_ = (int)auVar80._4_4_;
            auVar125._8_4_ = (int)auVar80._8_4_;
            auVar125._12_4_ = (int)auVar80._12_4_;
            auVar128._16_4_ = (int)auVar80._16_4_;
            auVar128._0_16_ = auVar125;
            auVar128._20_4_ = (int)auVar80._20_4_;
            auVar128._24_4_ = (int)auVar80._24_4_;
            auVar128._28_4_ = (int)auVar80._28_4_;
            auVar102 = vpslld_avx(auVar125,0x17);
            auVar93 = vpslld_avx(auVar128._16_16_,0x17);
            auVar93 = vpaddd_avx(auVar149,auVar93);
            auVar102 = vpaddd_avx(auVar149,auVar102);
            auVar85._0_4_ =
                 fVar134 + auVar115._0_4_ * auVar147._0_4_ + fVar79 +
                 auVar104._0_4_ * auVar135._0_4_;
            auVar85._4_4_ =
                 fVar139 + auVar115._4_4_ * auVar147._4_4_ + fVar87 +
                 auVar104._4_4_ * auVar135._4_4_;
            auVar85._8_4_ =
                 fVar140 + auVar115._8_4_ * auVar147._8_4_ + fVar88 +
                 auVar104._8_4_ * auVar135._8_4_;
            auVar85._12_4_ =
                 fVar141 + auVar115._12_4_ * auVar147._12_4_ + fVar89 +
                 auVar104._12_4_ * auVar135._12_4_;
            auVar85._16_4_ =
                 fVar142 + auVar115._16_4_ * auVar147._16_4_ + fVar90 +
                 auVar104._16_4_ * auVar135._16_4_;
            auVar85._20_4_ =
                 fVar143 + auVar115._20_4_ * auVar147._20_4_ + fVar91 +
                 auVar104._20_4_ * auVar135._20_4_;
            auVar85._24_4_ =
                 fVar144 + auVar115._24_4_ * auVar147._24_4_ + fVar92 +
                 auVar104._24_4_ * auVar135._24_4_;
            auVar85._28_4_ = auVar147._28_4_ + 2.718064 + fVar133 + fVar133;
            auVar22._4_4_ = auVar85._4_4_ * -2.0;
            auVar22._0_4_ = auVar85._0_4_ * -2.0;
            auVar22._8_4_ = auVar85._8_4_ * -2.0;
            auVar22._12_4_ = auVar85._12_4_ * -2.0;
            auVar22._16_4_ = auVar85._16_4_ * -2.0;
            auVar22._20_4_ = auVar85._20_4_ * -2.0;
            auVar22._24_4_ = auVar85._24_4_ * -2.0;
            auVar22._28_4_ = 0xc0000000;
            auVar80 = vminps_avx(auVar150,auVar22);
            auVar109._8_4_ = 0xc2b0c0a5;
            auVar109._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar109._12_4_ = 0xc2b0c0a5;
            auVar109._16_4_ = 0xc2b0c0a5;
            auVar109._20_4_ = 0xc2b0c0a5;
            auVar109._24_4_ = 0xc2b0c0a5;
            auVar109._28_4_ = 0xc2b0c0a5;
            auVar94 = vmaxps_avx(auVar80,auVar109);
            auVar110._0_4_ = auVar94._0_4_ * 1.442695 + 0.5;
            auVar110._4_4_ = auVar94._4_4_ * 1.442695 + 0.5;
            auVar110._8_4_ = auVar94._8_4_ * 1.442695 + 0.5;
            auVar110._12_4_ = auVar94._12_4_ * 1.442695 + 0.5;
            auVar110._16_4_ = auVar94._16_4_ * 1.442695 + 0.5;
            auVar110._20_4_ = auVar94._20_4_ * 1.442695 + 0.5;
            auVar110._24_4_ = auVar94._24_4_ * 1.442695 + 0.5;
            auVar110._28_4_ = 0xc2afc0a5;
            auVar104 = vroundps_avx(auVar110,1);
            auVar80 = vcmpps_avx(auVar110,auVar104,1);
            auVar80 = vandps_avx(auVar80,auVar146);
            auVar80 = vsubps_avx(auVar104,auVar80);
            auVar23._4_4_ = auVar80._4_4_ * 0.6931472;
            auVar23._0_4_ = auVar80._0_4_ * 0.6931472;
            auVar23._8_4_ = auVar80._8_4_ * 0.6931472;
            auVar23._12_4_ = auVar80._12_4_ * 0.6931472;
            auVar23._16_4_ = auVar80._16_4_ * 0.6931472;
            auVar23._20_4_ = auVar80._20_4_ * 0.6931472;
            auVar23._24_4_ = auVar80._24_4_ * 0.6931472;
            auVar23._28_4_ = auVar104._28_4_;
            auVar94 = vsubps_avx(auVar94,auVar23);
            fVar134 = auVar94._0_4_;
            fVar139 = auVar94._4_4_;
            fVar140 = auVar94._8_4_;
            fVar133 = auVar94._12_4_;
            fVar79 = auVar94._16_4_;
            fVar87 = auVar94._20_4_;
            fVar88 = auVar94._24_4_;
            in_ZMM6 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar122._0_4_ =
                 (fVar124 + 1.0 +
                 fVar124 * fVar124 *
                 (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                   0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5)) * auVar102._0_4_ + 1.0;
            auVar122._4_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar102._4_4_ + 1.0;
            auVar122._8_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar102._8_4_ + 1.0;
            auVar122._12_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar102._12_4_ + 1.0;
            auVar122._16_4_ =
                 (fVar151 + 1.0 +
                 fVar151 * fVar151 *
                 (((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) * fVar151 +
                   0.041665796) * fVar151 + 0.16666666) * fVar151 + 0.5)) * auVar93._0_4_ + 1.0;
            auVar122._20_4_ =
                 (fVar12 + 1.0 +
                 fVar12 * fVar12 *
                 (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
                   0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar93._4_4_ + 1.0;
            auVar122._24_4_ =
                 (fVar13 + 1.0 +
                 fVar13 * fVar13 *
                 (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
                   0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5)) * auVar93._8_4_ + 1.0;
            auVar122._28_4_ = auVar81._28_4_ + 1.0 + auVar126._28_4_ + 1.0;
            auVar103._0_4_ = (int)auVar80._0_4_;
            auVar103._4_4_ = (int)auVar80._4_4_;
            auVar103._8_4_ = (int)auVar80._8_4_;
            auVar103._12_4_ = (int)auVar80._12_4_;
            auVar111._16_4_ = (int)auVar80._16_4_;
            auVar111._0_16_ = auVar103;
            auVar111._20_4_ = (int)auVar80._20_4_;
            auVar111._24_4_ = (int)auVar80._24_4_;
            auVar111._28_4_ = (int)auVar80._28_4_;
            auVar102 = vpslld_avx(auVar103,0x17);
            auVar93 = vpslld_avx(auVar111._16_16_,0x17);
            auVar93 = vpaddd_avx(auVar149,auVar93);
            auVar102 = vpaddd_avx(auVar149,auVar102);
            auVar99._0_4_ =
                 (fVar134 + 1.0 +
                 fVar134 * fVar134 *
                 (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5)) * auVar102._0_4_ + 1.0;
            auVar99._4_4_ =
                 (fVar139 + 1.0 +
                 fVar139 * fVar139 *
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar102._4_4_ + 1.0;
            auVar99._8_4_ =
                 (fVar140 + 1.0 +
                 fVar140 * fVar140 *
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar102._8_4_ + 1.0;
            auVar99._12_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar102._12_4_ + 1.0;
            auVar99._16_4_ =
                 (fVar79 + 1.0 +
                 fVar79 * fVar79 *
                 (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                   0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5)) * auVar93._0_4_ + 1.0;
            auVar99._20_4_ =
                 (fVar87 + 1.0 +
                 fVar87 * fVar87 *
                 (((((fVar87 * 0.00019875691 + 0.0013981999) * fVar87 + 0.008333452) * fVar87 +
                   0.041665796) * fVar87 + 0.16666666) * fVar87 + 0.5)) * auVar93._4_4_ + 1.0;
            auVar99._24_4_ =
                 (fVar88 + 1.0 +
                 fVar88 * fVar88 *
                 (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
                   0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5)) * auVar93._8_4_ + 1.0;
            auVar99._28_4_ = auVar94._28_4_ + 1.0 + auVar104._28_4_ + 1.0;
            auVar80 = vrcpps_avx(auVar99);
            fVar124 = auVar80._0_4_;
            fVar134 = auVar80._4_4_;
            fVar130 = auVar80._8_4_;
            fVar139 = auVar80._12_4_;
            fVar131 = auVar80._16_4_;
            fVar140 = auVar80._20_4_;
            fVar132 = auVar80._24_4_;
            auVar24._4_4_ = auVar99._4_4_ * (fVar134 + fVar134);
            auVar24._0_4_ = auVar99._0_4_ * (fVar124 + fVar124);
            auVar24._8_4_ = auVar99._8_4_ * (fVar130 + fVar130);
            auVar24._12_4_ = auVar99._12_4_ * (fVar139 + fVar139);
            auVar24._16_4_ = auVar99._16_4_ * (fVar131 + fVar131);
            auVar24._20_4_ = auVar99._20_4_ * (fVar140 + fVar140);
            auVar24._24_4_ = auVar99._24_4_ * (fVar132 + fVar132);
            auVar24._28_4_ = auVar99._28_4_;
            auVar137._8_4_ = 0x40000000;
            auVar137._0_8_ = 0x4000000040000000;
            auVar137._12_4_ = 0x40000000;
            auVar137._16_4_ = 0x40000000;
            auVar137._20_4_ = 0x40000000;
            auVar137._24_4_ = 0x40000000;
            auVar137._28_4_ = 0x40000000;
            auVar104 = vsubps_avx(auVar137,auVar24);
            auVar94 = vrcpps_avx(auVar122);
            in_ZMM5 = ZEXT3264(CONCAT428(0xbf800000,
                                         CONCAT424(0xbf800000,
                                                   CONCAT420(0xbf800000,
                                                             CONCAT416(0xbf800000,
                                                                       CONCAT412(0xbf800000,
                                                                                 CONCAT48(0xbf800000
                                                                                          ,
                                                  0xbf800000bf800000)))))));
            fVar133 = auVar80._28_4_ + auVar80._28_4_ + -1.0;
            auVar100._0_4_ = fVar124 + fVar124 + -1.0 + fVar124 * auVar104._0_4_;
            auVar100._4_4_ = fVar134 + fVar134 + -1.0 + fVar134 * auVar104._4_4_;
            auVar100._8_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar104._8_4_;
            auVar100._12_4_ = fVar139 + fVar139 + -1.0 + fVar139 * auVar104._12_4_;
            auVar100._16_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar104._16_4_;
            auVar100._20_4_ = fVar140 + fVar140 + -1.0 + fVar140 * auVar104._20_4_;
            auVar100._24_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar104._24_4_;
            auVar100._28_4_ = fVar133 + auVar104._28_4_;
            fVar124 = auVar100._0_4_ * auVar94._0_4_;
            fVar134 = auVar100._4_4_ * auVar94._4_4_;
            fVar130 = auVar100._8_4_ * auVar94._8_4_;
            fVar139 = auVar100._12_4_ * auVar94._12_4_;
            fVar131 = auVar100._16_4_ * auVar94._16_4_;
            fVar140 = auVar100._20_4_ * auVar94._20_4_;
            fVar132 = auVar100._24_4_ * auVar94._24_4_;
            auVar25._4_4_ = auVar122._4_4_ * fVar134;
            auVar25._0_4_ = auVar122._0_4_ * fVar124;
            auVar25._8_4_ = auVar122._8_4_ * fVar130;
            auVar25._12_4_ = auVar122._12_4_ * fVar139;
            auVar25._16_4_ = auVar122._16_4_ * fVar131;
            auVar25._20_4_ = auVar122._20_4_ * fVar140;
            auVar25._24_4_ = auVar122._24_4_ * fVar132;
            auVar25._28_4_ = auVar122._28_4_;
            in_ZMM3 = ZEXT3264(auVar25);
            auVar80 = vsubps_avx(auVar100,auVar25);
            fVar124 = fVar124 + auVar94._0_4_ * auVar80._0_4_;
            fVar134 = fVar134 + auVar94._4_4_ * auVar80._4_4_;
            fVar130 = fVar130 + auVar94._8_4_ * auVar80._8_4_;
            fVar139 = fVar139 + auVar94._12_4_ * auVar80._12_4_;
            fVar131 = fVar131 + auVar94._16_4_ * auVar80._16_4_;
            fVar140 = fVar140 + auVar94._20_4_ * auVar80._20_4_;
            fVar132 = fVar132 + auVar94._24_4_ * auVar80._24_4_;
            fVar133 = fVar133 + auVar80._28_4_;
            *(undefined1 (*) [32])((long)pvVar63 + lVar30) = auVar85;
            pfVar3 = (float *)((long)pvVar59 + lVar30);
            *pfVar3 = fVar124;
            pfVar3[1] = fVar134;
            pfVar3[2] = fVar130;
            pfVar3[3] = fVar139;
            pfVar3[4] = fVar131;
            pfVar3[5] = fVar140;
            pfVar3[6] = fVar132;
            pfVar3[7] = fVar133;
            pfVar3 = (float *)((long)pvVar71 + lVar30);
            *pfVar3 = fVar124;
            pfVar3[1] = fVar134;
            pfVar3[2] = fVar130;
            pfVar3[3] = fVar139;
            pfVar3[4] = fVar131;
            pfVar3[5] = fVar140;
            pfVar3[6] = fVar132;
            pfVar3[7] = fVar133;
            iVar28 = iVar28 + -1;
            lVar30 = lVar30 + 0x20;
          } while (1 < iVar28);
          pAVar53 = pAVar53 + lVar30;
          pAVar46 = pAVar46 + lVar30;
          pAVar42 = pAVar42 + lVar30;
          pAVar57 = (Allocator *)((long)local_78.data + lVar30);
          pvVar59 = (void *)((long)pvVar59 + lVar30);
          pvVar63 = (void *)((long)pvVar63 + lVar30);
          pvVar71 = (void *)((long)pvVar71 + lVar30);
        }
        if ((uVar58 & 7) != 0) {
          lVar30 = 0;
          iVar28 = iVar40;
          do {
            fVar124 = *(float *)(pAVar53 + lVar30);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            fVar134 = expf(-*(float *)(pAVar57 + lVar30));
            fVar130 = expf(-*(float *)(pAVar42 + lVar30));
            fVar139 = expf(-*(float *)(pAVar46 + lVar30));
            fVar124 = tanhf(fVar124);
            fVar124 = *(float *)((long)pvVar63 + lVar30) / (fVar130 + 1.0) +
                      fVar124 / (fVar134 + 1.0);
            fVar134 = tanhf(fVar124);
            fVar134 = fVar134 / (fVar139 + 1.0);
            *(float *)((long)pvVar63 + lVar30) = fVar124;
            *(float *)((long)pvVar59 + lVar30) = fVar134;
            *(float *)((long)pvVar71 + lVar30) = fVar134;
            iVar28 = iVar28 + -1;
            lVar30 = lVar30 + 4;
          } while (1 < iVar28);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 != uVar9);
    }
    iVar39 = 0;
  }
  piVar26 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_78.data != (Allocator *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (**(code **)(*(long *)local_78.allocator + 0x18))();
      }
    }
  }
  return iVar39;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanh(cell2);
            cell_state[q] = cell2;
            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}